

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

Expr * primary_expr(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Expr *pEVar4;
  ushort **ppuVar5;
  Section *sec;
  Symbol *pSVar6;
  ScriptFunc *sfptr;
  Symbol *sym;
  char *word;
  int base;
  Expr *new;
  int type;
  lword val;
  uint8_t in_stack_ffffffffffffffbf;
  ScriptFunc *local_40;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_14;
  lword local_10;
  Expr *local_8;
  
  local_10 = 0;
  local_14 = 0x15;
  if (*s == '(') {
    s = s + 1;
    skip();
    pEVar4 = expression();
    if (*s == ')') {
      s = s + 1;
    }
    else {
      error(0x42,scriptname,(ulong)(uint)line,0x29);
    }
    skip();
    local_8 = pEVar4;
  }
  else {
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[(int)(uint)(byte)*s] & 0x800) == 0) {
      sec = (Section *)getarg(in_stack_ffffffffffffffbf);
      if (sec == (Section *)0x0) {
        error(0x4e,scriptname,(ulong)(uint)line);
      }
      else if ((*(char *)&(sec->n).next == '.') && (*(char *)((long)&(sec->n).next + 1) == '\0')) {
        if (caddr == -1) {
          error(0x65,scriptname,(ulong)(uint)line);
        }
        else if (caddr != -2) {
          local_10 = caddr;
          local_14 = 0x16;
        }
      }
      else {
        pSVar6 = findsymbol((GlobalVars *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),sec,
                            in_stack_ffffffffffffffc8);
        if (pSVar6 == (Symbol *)0x0) {
          local_40 = ldFunctions;
          while ((local_40->name != (char *)0x0 &&
                 (iVar3 = strcmp(local_40->name,(char *)sec), iVar3 != 0))) {
            local_40 = local_40 + 1;
          }
          if (local_40->name == (char *)0x0) {
            if (caddr != -2) {
              error(0x68,scriptname,(ulong)(uint)line,sec);
            }
          }
          else if (caddr == -2) {
            cVar2 = getchr();
            if (cVar2 == '(') {
              skipblock(0,'\0','\x11');
            }
            else {
              back(1);
            }
          }
          else if (caddr == -1) {
            error(0x69,scriptname,(ulong)(uint)line);
          }
          else {
            iVar3 = (*local_40->funcptr)(gv,caddr,&local_10);
            local_14 = 0x16;
            if (iVar3 != 0) {
              local_14 = 0x15;
            }
          }
        }
        else if ((caddr == -1) && (pSVar6->type != '\x01')) {
          error(0x66,scriptname,(ulong)(uint)line,pSVar6->name);
        }
        else if (caddr != -2) {
          if (pSVar6->type == '\x01') {
            local_10 = pSVar6->value;
          }
          else if ((pSVar6->type == '\x02') && (pSVar6->relsect->lnksec != (LinkedSection *)0x0)) {
            local_10 = pSVar6->relsect->va + pSVar6->value;
            local_14 = 0x16;
          }
          else {
            error(0x6a,scriptname,(ulong)(uint)line,pSVar6->name);
          }
        }
      }
    }
    else {
      if ((*s == '0') && ((s[1] == 'x' || (s[1] == 'X')))) {
        s = s + 2;
        while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)(byte)*s] & 0x1000) != 0) {
          if ((*s < '0') || ('9' < *s)) {
            if ((*s < 'a') || ('f' < *s)) {
              local_10 = local_10 * 0x10 + (long)*s + -0x37;
            }
            else {
              local_10 = local_10 * 0x10 + (long)*s + -0x57;
            }
          }
          else {
            local_10 = local_10 * 0x10 + (long)*s + -0x30;
          }
          s = s + 1;
        }
      }
      else {
        iVar3 = 10;
        if (*s == '0') {
          iVar3 = 8;
        }
        while( true ) {
          bVar1 = false;
          if ('/' < *s) {
            bVar1 = (int)*s < iVar3 + 0x30;
          }
          if (!bVar1) break;
          local_10 = iVar3 * local_10 + (long)*s + -0x30;
          s = s + 1;
        }
      }
      iVar3 = toupper((uint)(byte)*s);
      if (iVar3 == 0x4b) {
        local_10 = local_10 << 10;
        s = s + 1;
      }
      else {
        iVar3 = toupper((uint)(byte)*s);
        if (iVar3 == 0x4d) {
          local_10 = local_10 << 0x14;
          s = s + 1;
        }
      }
    }
    skip();
    local_8 = new_expr();
    local_8->type = local_14;
    local_8->val = local_10;
  }
  return local_8;
}

Assistant:

static struct Expr *primary_expr(void)
{
  lword val = 0;
  int type = ABS;
  struct Expr *new;

  if (*s == '(') {
    s++;
    skip();
    new = expression();
    if (*s != ')')
      error(66,scriptname,line,')');  /* ')' expected */
    else
      s++;
    skip();
    return new;
  }

  if (isdigit((unsigned char)*s)) {
    /* octal, decimal or hex constant */
    if (s[0]=='0' && (s[1]=='x' || s[1]=='X')) {
      s += 2;
      while (isxdigit((unsigned char)*s)) {
        if (*s>='0' && *s<='9')
          val = (val<<4) + *s++ - '0';
        else if (*s>='a' && *s<='f')
          val = (val<<4) + *s++ - 'a' + 10;
        else
          val = (val<<4) + *s++ - 'A' + 10;
      }
    }
    else {
      int base = (*s=='0') ? 8 : 10;

      while (*s>='0' && *s<('0'+base)) {
        val = base*val + *s++ - '0';
      }
    }

    if (toupper((unsigned char)*s) == 'K') {
      val <<= 10;
      s++;
    }
    else if (toupper((unsigned char)*s) == 'M') {
      val <<= 20;
      s++;
    }
  }

  else {
    char *word;

    if (word = getarg(1)) {
      if (word[0]=='.' && word[1]=='\0') {  /* current address symbol '.' */
        if (caddr != -1) {
          if (caddr != -2) {
            val = caddr;
            type = REL;
          }
        }
        else {
          /* Address symbol '.' invalid outside SECTIONS block */
          error(101,scriptname,line);
        }
      }
      else {  /* otherwise it's possibly a function- or symbol-name */
        struct Symbol *sym;

        if (sym = findsymbol(gv,NULL,word)) {
          if (caddr==-1 && sym->type!=SYM_ABS) {
            /* Reference to non-absolute symbol */
            error(102,scriptname,line,sym->name);
          }
          else if (caddr != -2) {
            if (sym->type == SYM_ABS) {
              val = sym->value;
            }
            else if (sym->type==SYM_RELOC && sym->relsect->lnksec!=NULL) {
              val = (lword)sym->relsect->va + sym->value;
              type = REL;
            }
            else {
              /* Symbol is not yet assigned */
              error(106,scriptname,line,sym->name);
            }
          }
        }
        else {
          struct ScriptFunc *sfptr;

          for (sfptr=ldFunctions; sfptr->name; sfptr++) {
            if (!strcmp(sfptr->name,word))
              break;
          }
          if (sfptr->name) {
            if (caddr == -2) {
              if (getchr() == '(')
                skipblock(1,'(',')');
              else
                back(1);
            }
            else if (caddr != -1)
              type = sfptr->funcptr(gv,caddr,&val) ? ABS : REL;
            else
              error(105,scriptname,line);  /* No function-calls allowed here */
          }
          else if (caddr != -2)
            error(104,scriptname,line,word);  /* Unknown symbol or function */
        }
      }
    }
    else
      error(78,scriptname,line);   /* missing argument */
  }

  skip();
  new = new_expr();
  new->type = type;
  new->val = val;
  return new;
}